

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall ON_ArcCurve::ChangeClosedCurveSeam(ON_ArcCurve *this,double t)

{
  bool bVar1;
  ON_3dVector *axis;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ON_Interval local_38;
  double local_28;
  double angle_delta;
  double dStack_18;
  bool rc;
  double t_local;
  ON_ArcCurve *this_local;
  
  angle_delta._7_1_ = 0;
  dStack_18 = t;
  t_local = (double)this;
  bVar1 = IsCircle(this);
  if (bVar1) {
    dVar3 = ON_Interval::NormalizedParameterAt(&this->m_t,dStack_18);
    local_28 = dVar3 * 6.283185307179586;
    axis = ON_Plane::Normal((ON_Plane *)&this->m_arc);
    ON_Circle::Rotate(&(this->m_arc).super_ON_Circle,dVar3 * 6.283185307179586,axis);
    dVar3 = dStack_18;
    pdVar2 = ON_Interval::operator[](&this->m_t,1);
    dVar4 = *pdVar2 + dStack_18;
    pdVar2 = ON_Interval::operator[](&this->m_t,0);
    ON_Interval::ON_Interval(&local_38,dVar3,dVar4 - *pdVar2);
    (this->m_t).m_t[0] = local_38.m_t[0];
    (this->m_t).m_t[1] = local_38.m_t[1];
    angle_delta._7_1_ = 1;
  }
  return (bool)(angle_delta._7_1_ & 1);
}

Assistant:

bool ON_ArcCurve::ChangeClosedCurveSeam( 
            double t ){
	bool rc = false;
	if( IsCircle() ){
		double angle_delta = m_t.NormalizedParameterAt(t);
		angle_delta*= 2*ON_PI;
		
		m_arc.Rotate(angle_delta, m_arc.plane.Normal());
		m_t = ON_Interval( t, m_t[1] + t - m_t[0]);
		rc = true;
	}
	return rc;
}